

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart_advanced.c
# Opt level: O0

int main(int argc,char **argv)

{
  uint xonxoff;
  uint ctsrts;
  mraa_uart_parity_t parity;
  int databits;
  int stopbits;
  int baudrate;
  char buffer [12];
  mraa_uart_context uart;
  mraa_result_t status;
  char **argv_local;
  int argc_local;
  
  stopbits._0_1_ = 'H';
  stopbits._1_1_ = 'e';
  stopbits._2_1_ = 'l';
  stopbits._3_1_ = 'l';
  baudrate._0_1_ = 'o';
  baudrate._1_1_ = ' ';
  baudrate._2_1_ = 'M';
  baudrate._3_1_ = 'r';
  builtin_strncpy(buffer,"aa!",4);
  signal(2,sig_handler);
  mraa_init();
  buffer._4_8_ = mraa_uart_init_raw(dev_path);
  if (buffer._4_8_ == 0) {
    fprintf(_stderr,"Failed to initialize UART\n");
    argv_local._4_4_ = 1;
  }
  else {
    uart._4_4_ = mraa_uart_set_baudrate(buffer._4_8_,0x2580);
    if (((uart._4_4_ == 0) && (uart._4_4_ = mraa_uart_set_mode(buffer._4_8_,8,0,1), uart._4_4_ == 0)
        ) && (uart._4_4_ = mraa_uart_set_flowcontrol(buffer._4_8_,0,0), uart._4_4_ == 0)) {
      while (flag != 0) {
        mraa_uart_write(buffer._4_8_,&stopbits,0xc);
        sleep(1);
      }
      mraa_uart_stop(buffer._4_8_);
      mraa_deinit();
      argv_local._4_4_ = 0;
    }
    else {
      mraa_result_print(uart._4_4_);
      mraa_uart_stop(buffer._4_8_);
      mraa_deinit();
      argv_local._4_4_ = 1;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int
main(int argc, char** argv)
{
    mraa_result_t status = MRAA_SUCCESS;
    mraa_uart_context uart;
    char buffer[] = "Hello Mraa!";

    int baudrate = 9600, stopbits = 1, databits = 8;
    mraa_uart_parity_t parity = MRAA_UART_PARITY_NONE;
    unsigned int ctsrts = FALSE, xonxoff = FALSE;

    /* install signal handler */
    signal(SIGINT, sig_handler);

    /* initialize mraa for the platform (not needed most of the time) */
    mraa_init();

    //! [Interesting]
    /* initialize uart */
    uart = mraa_uart_init_raw(dev_path);
    if (uart == NULL) {
        fprintf(stderr, "Failed to initialize UART\n");
        return EXIT_FAILURE;
    }

    /* set serial port parameters */
    status = mraa_uart_set_baudrate(uart, baudrate);
    if (status != MRAA_SUCCESS) {
        goto err_exit;
    }
    status = mraa_uart_set_mode(uart, databits, parity, stopbits);
    if (status != MRAA_SUCCESS) {
        goto err_exit;
    }
    status = mraa_uart_set_flowcontrol(uart, xonxoff, ctsrts);
    if (status != MRAA_SUCCESS) {
        goto err_exit;
    }

    while (flag) {
        /* send data through uart */
        mraa_uart_write(uart, buffer, sizeof(buffer));

        sleep(1);
    }

    /* stop uart */
    mraa_uart_stop(uart);

    //! [Interesting]
    /* deinitialize mraa for the platform (not needed most of the time) */
    mraa_deinit();

    return EXIT_SUCCESS;

err_exit:
    mraa_result_print(status);

    /* stop uart */
    mraa_uart_stop(uart);

    /* deinitialize mraa for the platform (not needed most of the times) */
    mraa_deinit();

    return EXIT_FAILURE;
}